

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
pbrt::ParameterDictionary::
lookupArray<unsigned_char,pstd::vector<unsigned_char,pstd::pmr::polymorphic_allocator<unsigned_char>>const&(*)(pbrt::ParsedParameter_const&),bool(*)(unsigned_char_const*,pbrt::FileLoc_const*)>
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          ParameterDictionary *this,string *name,ParameterType type,char *typeName,int nPerItem,
          _func_vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>_ptr_ParsedParameter_ptr
          *getValues,_func_bool_uchar_ptr_FileLoc_ptr *convert)

{
  string *__lhs;
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar1;
  size_t sVar2;
  ParsedParameter *__lhs_00;
  ulong uVar3;
  __type_conflict _Var4;
  bool bVar5;
  vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *pvVar6;
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar7;
  ulong uVar8;
  size_t i;
  ulong uVar9;
  long lVar10;
  allocator_type local_49;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_48;
  int local_40;
  int local_3c;
  char *local_38;
  
  paVar1 = (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
            *)(this->params).ptr;
  sVar2 = (this->params).nStored;
  paVar7 = &(this->params).field_2;
  if (paVar1 != (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
                 *)0x0) {
    paVar7 = paVar1;
  }
  lVar10 = 0;
  local_48 = __return_storage_ptr__;
  local_40 = nPerItem;
  local_38 = typeName;
  while( true ) {
    if (sVar2 << 3 == lVar10) {
      (local_48->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (local_48->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (local_48->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      return local_48;
    }
    __lhs_00 = *(ParsedParameter **)((long)paVar7 + lVar10);
    __lhs = &__lhs_00->name;
    _Var4 = std::operator==(__lhs,name);
    if ((_Var4) && (bVar5 = std::operator==(&__lhs_00->type,local_38), bVar5)) break;
    lVar10 = lVar10 + 8;
  }
  pvVar6 = (*getValues)(__lhs_00);
  local_3c = local_40;
  uVar3 = pvVar6->nStored;
  if (uVar3 != 0) {
    uVar8 = (ulong)local_40;
    if (uVar3 % uVar8 == 0) {
      __lhs_00->lookedUp = true;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (local_48,uVar3 / uVar8,&local_49);
      lVar10 = 0;
      for (uVar9 = 0; uVar9 < uVar3 / uVar8; uVar9 = uVar9 + 1) {
        bVar5 = (*convert)(pvVar6->ptr + lVar10,&__lhs_00->loc);
        lVar10 = lVar10 + uVar8;
        (local_48->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_start[uVar9] = bVar5;
      }
      return local_48;
    }
    ErrorExit<std::__cxx11::string_const&,int&>
              (&__lhs_00->loc,"Number of values provided for \"%s\" not a multiple of %d",__lhs,
               &local_3c);
  }
  ErrorExit<std::__cxx11::string_const&>(&__lhs_00->loc,"No values provided for \"%s\".",__lhs);
}

Assistant:

std::vector<ReturnType> ParameterDictionary::lookupArray(const std::string &name,
                                                         ParameterType type,
                                                         const char *typeName,
                                                         int nPerItem, G getValues,
                                                         C convert) const {
    for (const ParsedParameter *p : params)
        if (p->name == name && p->type == typeName)
            return returnArray<ReturnType>(getValues(*p), *p, nPerItem, convert);

    return {};
}